

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

void ipc_ep_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  ipc_ep *ep;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)arg);
  if ((*(byte *)((long)arg + 0x33) & 1) == 0) {
    if (*(long *)((long)arg + 0x58) == 0) {
      _Var1 = nni_aio_start(aio,ipc_ep_cancel,arg);
      if (_Var1) {
        *(nni_aio **)((long)arg + 0x58) = aio;
        if ((*(byte *)((long)arg + 0x32) & 1) == 0) {
          *(undefined1 *)((long)arg + 0x32) = 1;
          nng_stream_listener_accept
                    (*(nng_stream_listener **)((long)arg + 0x40),(nng_aio *)((long)arg + 0x60));
        }
        else {
          ipc_ep_match((ipc_ep *)arg);
        }
        nni_mtx_unlock((nni_mtx *)arg);
      }
      else {
        nni_mtx_unlock((nni_mtx *)arg);
      }
    }
    else {
      nni_aio_finish_error(aio,NNG_EBUSY);
      nni_mtx_unlock((nni_mtx *)arg);
    }
  }
  else {
    nni_aio_finish_error(aio,NNG_ECLOSED);
    nni_mtx_unlock((nni_mtx *)arg);
  }
  return;
}

Assistant:

static void
ipc_ep_accept(void *arg, nni_aio *aio)
{
	ipc_ep *ep = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (ep->user_aio != NULL) {
		nni_aio_finish_error(aio, NNG_EBUSY);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (!nni_aio_start(aio, ipc_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	ep->user_aio = aio;
	if (!ep->started) {
		ep->started = true;
		nng_stream_listener_accept(ep->listener, &ep->conn_aio);
	} else {
		ipc_ep_match(ep);
	}

	nni_mtx_unlock(&ep->mtx);
}